

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json2map.c
# Opt level: O2

int json2map_parseObject
              (json2map_t *obj,char *path,char *jsonString,jsmntok_t *token,int start,int end)

{
  jsmntok_t *token_00;
  jsmntype_t jVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  csafestring_t *obj_00;
  csafestring_t *pcVar7;
  csafestring_t *pcVar8;
  char *__ptr;
  csafestring_t *obj_01;
  ulong uVar9;
  long value;
  char local_58 [40];
  
  uVar9 = (ulong)(uint)start;
  do {
    iVar5 = (int)uVar9;
    if ((end <= iVar5) || (iVar5 < 1)) {
      if (iVar5 < 0) {
        end = iVar5;
      }
      return end;
    }
    if (token[uVar9].type != JSMN_STRING) {
      return -1;
    }
    pcVar6 = json2map_setTokenValue(jsonString,token + uVar9);
    obj_00 = json2map_concatPaths(path,pcVar6,-1);
    free(pcVar6);
    jVar1 = token[uVar9 + 1].type;
    if (jVar1 - JSMN_STRING < 2) {
      pcVar6 = json2map_setTokenValue(jsonString,token + uVar9 + 1);
      if (obj->dataMapHook != (_func_void_void_ptr_char_ptr_char_ptr *)0x0) {
        (*obj->dataMapHook)(obj->dataMapData,obj_00->data,pcVar6);
      }
      free(pcVar6);
      uVar9 = (ulong)(iVar5 + 2);
    }
    else if (jVar1 == JSMN_ARRAY) {
      iVar3 = json2map_calcEnd(token,iVar5 + 1,end);
      pcVar6 = obj_00->data;
      uVar4 = iVar5 + 2;
      value = 0;
      while (((int)uVar4 <= iVar3 && (0 < (int)uVar4))) {
        pcVar7 = json2map_concatPaths((char *)0x0,pcVar6,(int)value);
        token_00 = token + uVar4;
        if (token[uVar4].type - JSMN_STRING < 2) {
          __ptr = json2map_setTokenValue(jsonString,token_00);
          if (obj->dataMapHook != (_func_void_void_ptr_char_ptr_char_ptr *)0x0) {
            (*obj->dataMapHook)(obj->dataMapData,pcVar7->data,__ptr);
          }
          free(__ptr);
          uVar4 = uVar4 + 1;
        }
        else {
          if (token[uVar4].type != JSMN_OBJECT) {
            uVar9 = 0xffffffff;
            goto LAB_00104554;
          }
          iVar5 = json2map_calcEnd(token,uVar4,iVar3 + 1U);
          if (obj->saveSubobjectString != '\0') {
            pcVar8 = safe_clone(pcVar7);
            safe_strchrappend(pcVar8,'[');
            safe_strchrappend(pcVar8,'o');
            safe_strchrappend(pcVar8,']');
            obj_01 = safe_create((char *)0x0);
            safe_memset(obj_01,0,(long)((token_00->end - token_00->start) + 1));
            safe_memcpy(obj_01,jsonString + token_00->start,
                        (long)token_00->end - (long)token_00->start);
            (*obj->dataMapHook)(obj->dataMapData,pcVar8->data,obj_01->data);
            safe_destroy(obj_01);
            safe_destroy(pcVar8);
          }
          uVar4 = json2map_parseObject(obj,pcVar7->data,jsonString,token,uVar4 + 1,iVar5 + 1);
        }
        safe_destroy(pcVar7);
        value = value + 1;
      }
      pcVar7 = json2map_concatPaths((char *)0x0,pcVar6,-2);
      stringlib_longToString(local_58,value);
      if (obj->dataMapHook != (_func_void_void_ptr_char_ptr_char_ptr *)0x0) {
        (*obj->dataMapHook)(obj->dataMapData,pcVar7->data,local_58);
      }
      safe_destroy(pcVar7);
      uVar2 = iVar3 + 1U;
      if ((int)uVar4 < 0) {
        uVar2 = uVar4;
      }
      uVar9 = (ulong)uVar2;
    }
    else {
      if (jVar1 != JSMN_OBJECT) {
        return -1;
      }
      iVar3 = json2map_calcEnd(token,iVar5 + 1,end);
      if (obj->saveSubobjectString != '\0') {
        pcVar7 = safe_clone(obj_00);
        safe_strchrappend(pcVar7,'[');
        safe_strchrappend(pcVar7,'o');
        safe_strchrappend(pcVar7,']');
        pcVar8 = safe_create((char *)0x0);
        safe_memset(pcVar8,0,(long)((token[uVar9 + 1].end - token[uVar9 + 1].start) + 1));
        safe_memcpy(pcVar8,jsonString + token[uVar9 + 1].start,
                    (long)token[uVar9 + 1].end - (long)token[uVar9 + 1].start);
        (*obj->dataMapHook)(obj->dataMapData,pcVar7->data,pcVar8->data);
        safe_destroy(pcVar8);
        safe_destroy(pcVar7);
      }
      uVar4 = json2map_parseObject(obj,obj_00->data,jsonString,token,iVar5 + 2,iVar3 + 1);
      uVar9 = (ulong)uVar4;
    }
LAB_00104554:
    safe_destroy(obj_00);
  } while( true );
}

Assistant:

static int json2map_parseObject(json2map_t *obj, char *path, char *jsonString, jsmntok_t *token, int start, int end) {
	DEBUG_TEXT("json2map_parseObject([json2map_t *], %s, %s, [jsmntok_t *], %d, %d)...", path, jsonString, start, end);

	int newEnd;
	char *buffer;
	csafestring_t *pathBuff = NULL;
	csafestring_t *objPathBuff = NULL;

	int i = start;
	while ( i < end && i > 0 ) {
		if ( token[i].type == JSMN_STRING ) {
			buffer = json2map_setTokenValue(jsonString, &token[i]);
			pathBuff = json2map_concatPaths(path, buffer, -1);
			free(buffer);
		} else {
			DEBUG_TEXT("json2map_parseObject([json2map_t *], %s, %s, [jsmntok_t *], %d, %d): ERROR: Name of object has to be a string", path, jsonString, start, end);
			return -1;
		}
		i++;

		switch ( token[i].type ) {
			case JSMN_OBJECT:
				newEnd = json2map_calcEnd(token, i, end);

				if ( obj->saveSubobjectString ) {
					objPathBuff = safe_clone(pathBuff);
					safe_strchrappend(objPathBuff, JSON2MAP_MAP_ARRAY_START);
					safe_strchrappend(objPathBuff, JSON2MAP_MAP_OBJECT_CODE);
					safe_strchrappend(objPathBuff, JSON2MAP_MAP_ARRAY_END);
					
					csafestring_t *tmp = safe_create(NULL);
					safe_memset(tmp, '\0', token[i].end - token[i].start + 1);
					safe_memcpy(tmp, &jsonString[token[i].start], token[i].end - token[i].start);

					obj->dataMapHook(obj->dataMapData, objPathBuff->data, tmp->data);
					safe_destroy(tmp);
					safe_destroy(objPathBuff);
				}

				i = json2map_parseObject(obj, pathBuff->data, jsonString, token, i + 1, newEnd + 1);
				break;
			case JSMN_STRING:
			case JSMN_PRIMITIVE:
				buffer = json2map_setTokenValue(jsonString, &token[i]);
				if ( obj->dataMapHook != NULL ) {
					obj->dataMapHook(obj->dataMapData, pathBuff->data, buffer);
				}
				free(buffer);
				i++;
				break;
			case JSMN_ARRAY:
				newEnd = json2map_calcEnd(token, i, end);
				i = json2map_parseArray(obj, pathBuff->data, jsonString, token, i + 1, newEnd + 1);
				break;
			default:
				DEBUG_TEXT("json2map_parseObject([json2map_t *], %s, %s, [jsmntok_t *], %d, %d): ERROR: Not defined type", path, jsonString, start, end);
				return -1;
		}
		safe_destroy(pathBuff);
	}

	DEBUG_TEXT("json2map_parseObject([json2map_t *], %s, %s, [jsmntok_t *], %d, %d)... DONE", path, jsonString, start, end);
	if ( i < 0 ) {
		return i;
	}
	return end;
}